

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring.h
# Opt level: O1

int equal_case(CBS *a,CBS *b)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar3 = 0;
  if (a->len == b->len) {
    bVar7 = a->len == 0;
    if (!bVar7) {
      pbVar1 = a->data;
      pbVar2 = b->data;
      iVar4 = OPENSSL_tolower((uint)*pbVar1);
      iVar5 = OPENSSL_tolower((uint)*pbVar2);
      if (iVar4 == iVar5) {
        uVar6 = 1;
        do {
          bVar7 = a->len <= uVar6;
          if (bVar7) break;
          iVar4 = OPENSSL_tolower((uint)pbVar1[uVar6]);
          iVar5 = OPENSSL_tolower((uint)pbVar2[uVar6]);
          uVar6 = uVar6 + 1;
        } while (iVar4 == iVar5);
      }
    }
    uVar3 = (uint)bVar7;
  }
  return uVar3;
}

Assistant:

OPENSSL_INLINE size_t CBS_len(const CBS *cbs) { return cbs->len; }